

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O3

Query * simplify_subqueries(Query *__return_storage_ptr__,Query *q)

{
  pointer pQVar1;
  Query *__return_storage_ptr___00;
  uint32_t count;
  vector<Query,_std::allocator<Query>_> *pvVar2;
  QueryType *pQVar3;
  pointer q_00;
  vector<Query,_std::allocator<Query>_> newqueries;
  vector<Query,_std::allocator<Query>_> local_98;
  Query *local_80;
  Query local_78;
  
  local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_80 = __return_storage_ptr__;
  pvVar2 = Query::as_queries(q);
  q_00 = (pvVar2->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data
         ._M_start;
  pQVar1 = (pvVar2->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (q_00 != pQVar1) {
    do {
      q_optimize(&local_78,q_00);
      std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>(&local_98,&local_78);
      std::vector<Query,_std::allocator<Query>_>::~vector(&local_78.queries);
      std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_78.value);
      q_00 = q_00 + 1;
    } while (q_00 != pQVar1);
  }
  pQVar3 = Query::get_type(q);
  __return_storage_ptr___00 = local_80;
  if (*pQVar3 == MIN_OF) {
    count = Query::as_count(q);
    q_min_of(__return_storage_ptr___00,count,&local_98);
  }
  else {
    pQVar3 = Query::get_type(q);
    Query::Query(&local_78,pQVar3,&local_98);
    __return_storage_ptr___00->type = local_78.type;
    (__return_storage_ptr___00->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_78.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr___00->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr___00->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_78.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_78.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __return_storage_ptr___00->count = local_78.count;
    __return_storage_ptr___00->ngram = local_78.ngram;
    (__return_storage_ptr___00->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_78.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr___00->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr___00->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_78.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_78.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<Query,_std::allocator<Query>_>::~vector(&local_78.queries);
    std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_78.value);
  }
  std::vector<Query,_std::allocator<Query>_>::~vector(&local_98);
  return __return_storage_ptr___00;
}

Assistant:

Query simplify_subqueries(Query &&q) {
    // q_optimize ensures QueryType is not PRIMITIVE already
    std::vector<Query> newqueries;
    for (auto &&query : q.as_queries()) {
        newqueries.emplace_back(q_optimize(std::move(query)));
    }
    if (q.get_type() == QueryType::MIN_OF) {
        return q_min_of(q.as_count(), std::move(newqueries));
    }
    return std::move(Query(q.get_type(), std::move(newqueries)));
}